

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O0

bool __thiscall Hpipe::Cond::included_in(Cond *this,Cond *cond)

{
  bool bVar1;
  int local_24;
  int i;
  Cond *cond_local;
  Cond *this_local;
  
  local_24 = 0;
  while( true ) {
    if (0xff < local_24) {
      return true;
    }
    bVar1 = std::bitset<256UL>::operator[](&this->p,(long)local_24);
    if ((bVar1) && (bVar1 = std::bitset<256UL>::operator[](&cond->p,(long)local_24), !bVar1)) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool Cond::included_in( const Cond &cond ) const {
    for( int i = 0; i < p_size; ++i )
        if ( p[ i ] and not cond.p[ i ] )
            return false;
    return true;
}